

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

bool __thiscall
flow::lang::Parser::consumeOne<flow::lang::Token,flow::lang::Token>
          (Parser *this,Token a1,Token tokens)

{
  Token TVar1;
  Lexer *pLVar2;
  Report *this_00;
  allocator<char> local_49;
  string local_48;
  
  pLVar2 = (this->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  TVar1 = pLVar2->token_;
  if (TVar1 == tokens || TVar1 == a1) {
    nextToken(this);
  }
  else {
    this_00 = this->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unexpected token {}",&local_49);
    diagnostics::Report::syntaxError<flow::lang::Token>
              (this_00,&pLVar2->lastLocation_,&local_48,
               ((this->lexer_)._M_t.
                super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                _M_t.
                super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return TVar1 == tokens || TVar1 == a1;
}

Assistant:

inline bool Parser::consumeOne(A1 a1, Args... tokens) {
  if (!testTokens(a1, tokens...)) {
    report_.syntaxError(lastLocation(), "Unexpected token {}", token());
    return false;
  }

  nextToken();
  return true;
}